

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void hessenberg(double *A,int N)

{
  double *x_00;
  double *v_00;
  double *A_00;
  double *C;
  int iVar1;
  double alpha;
  double beta;
  double *w;
  double *AT;
  double *v;
  double *x;
  int u;
  int t;
  int j;
  int i;
  int k;
  int N_local;
  double *A_local;
  
  x_00 = (double *)malloc((long)N << 3);
  v_00 = (double *)malloc((long)N << 3);
  A_00 = (double *)malloc((long)N * 8 * (long)N);
  C = (double *)malloc((long)N << 3);
  for (j = 0; t = j, j < N + -2; j = j + 1) {
    while (t = t + 1, t < N) {
      x_00[(t - j) + -1] = A[t * N + j];
    }
    alpha = house(x_00,(N - j) + -1,v_00);
    t = j;
    while (t = t + 1, t < N) {
      x._0_4_ = 0;
      for (u = j; u < N; u = u + 1) {
        A_00[(((int)x + t) - j) + -1] = A[u + t * N];
        x._0_4_ = (N - j) + -1 + (int)x;
      }
    }
    mmult(A_00,v_00,C,N - j,(N - j) + -1,1);
    scale(C,N - j,1,alpha);
    mmult(v_00,C,A_00,(N - j) + -1,1,N - j);
    t = j;
    while (t = t + 1, t < N) {
      for (u = j; u < N; u = u + 1) {
        iVar1 = t * N + u;
        A[iVar1] = A[iVar1] - A_00[(((t - j) + -1) * (N - j) + u) - j];
      }
    }
    for (t = 0; t < N; t = t + 1) {
      u = j;
      while (u = u + 1, u < N) {
        A_00[((t * ((N - j) + -1) + u) - j) + -1] = A[t * N + u];
      }
    }
    mmult(A_00,v_00,C,N,(N - j) + -1,1);
    scale(C,N,1,alpha);
    mmult(C,v_00,A_00,N,1,(N - j) + -1);
    for (t = 0; t < N; t = t + 1) {
      u = j;
      while (u = u + 1, u < N) {
        iVar1 = t * N + u;
        A[iVar1] = A[iVar1] - A_00[((t * ((N - j) + -1) + u) - j) + -1];
      }
    }
  }
  free(x_00);
  free(v_00);
  free(A_00);
  free(C);
  return;
}

Assistant:

void hessenberg(double *A,int N) {
	int k,i,j,t,u;
	double *x,*v,*AT,*w;
	double beta;
	x = (double*) malloc(sizeof(double) * N);
	v = (double*) malloc(sizeof(double) * N);
	AT = (double*) malloc(sizeof(double) * N * N);
	w = (double*) malloc(sizeof(double) * N);
	
	for (k = 0; k < N-2;++k) {
		for(i=k + 1;i < N;++i) {
			x[i-k-1] = A[i*N+k];
			//printf("x %lf \n",x[i-k-1]);
			
		}
		
		beta = house(x,N-k-1,v);
		
		
		for (i=k+1; i < N; i++) {
			t = i * N;
			u = 0;
			for (j=k; j < N; j++) {
				AT[u+i-k-1] = A[j+t];
				u+=(N-k-1);				
			}
		}
		//mdisplay(AT,N-k,N-k-1);
		
		
		mmult(AT,v,w,N-k,N-k-1,1);
		scale(w,N-k,1,beta);
		mmult(v,w,AT,N-k-1,1,N-k);
		//mdisplay(AT,N-k-1,N-k);
		
		for (i=k+1; i < N; i++) {
			t = i * N;
			for (j=k; j < N; j++) {
				A[t+j] -= AT[(i-k-1)*(N-k) + j - k];
			}
		}
		//mdisplay(A,N,N);
		
		for (i=0; i < N; i++) {
			t = i * N;
			u = i * (N-k-1);
			for (j=k+1; j < N; j++) {
				AT[u+j-k-1] = A[t+j];
			}
		}
		//mdisplay(AT,N,N-k-1);
		
		mmult(AT,v,w,N,N-k-1,1);
		scale(w,N,1,beta);
		mmult(w,v,AT,N,1,N-k-1);
		//mdisplay(AT,N,N-k-1);
		
		for (i=0; i < N; i++) {
			t = i * N;
			u = i * (N-k-1);
			for (j=k+1; j < N; j++) {
				A[t+j] -= AT[u+j-k-1];
			}
		}
		
	}
	
	free(x);
	free(v);
	free(AT);
	free(w);
}